

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indiancal.cpp
# Opt level: O2

int32_t __thiscall
icu_63::IndianCalendar::handleGetMonthLength(IndianCalendar *this,int32_t eyear,int32_t month)

{
  byte bVar1;
  int32_t iVar2;
  int32_t month_local;
  
  month_local = month;
  if (0xb < (uint)month) {
    iVar2 = ClockMath::floorDivide((double)month,0xc,&month_local);
    eyear = eyear + iVar2;
  }
  iVar2 = month_local;
  bVar1 = isGregorianLeap(eyear + 0x4e);
  return (byte)(iVar2 - 1U < 5 | iVar2 == 0 & bVar1) | 0x1e;
}

Assistant:

int32_t IndianCalendar::handleGetMonthLength(int32_t eyear, int32_t month) const {
   if (month < 0 || month > 11) {
      eyear += ClockMath::floorDivide(month, 12, month);
   }

   if (isGregorianLeap(eyear + INDIAN_ERA_START) && month == 0) {
       return 31;
   }

   if (month >= 1 && month <= 5) {
       return 31;
   }

   return 30;
}